

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

AggregateFunction *
duckdb::ApproxQuantileDecimalFunction(AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  InternalException *this;
  allocator local_39;
  LogicalType local_38 [32];
  
  switch(type[1]) {
  case (LogicalType)0x3:
    duckdb::LogicalType::LogicalType(local_38,TINYINT);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,local_38);
    break;
  case (LogicalType)0x4:
  case (LogicalType)0x6:
  case (LogicalType)0x8:
switchD_005baac0_caseD_4:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)local_38,"Unimplemented quantile decimal aggregate",&local_39);
    duckdb::InternalException::InternalException(this,(string *)local_38);
    __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  case (LogicalType)0x5:
    duckdb::LogicalType::LogicalType(local_38,SMALLINT);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,local_38);
    break;
  case (LogicalType)0x7:
    duckdb::LogicalType::LogicalType(local_38,INTEGER);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,local_38);
    break;
  case (LogicalType)0x9:
    duckdb::LogicalType::LogicalType(local_38,BIGINT);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,local_38);
    break;
  default:
    if (type[1] != (LogicalType)0xcc) goto switchD_005baac0_caseD_4;
    duckdb::LogicalType::LogicalType(local_38,HUGEINT);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,local_38);
  }
  duckdb::LogicalType::~LogicalType(local_38);
  std::__cxx11::string::assign(&__return_storage_ptr__->field_0x8);
  __return_storage_ptr__->serialize = ApproximateQuantileBindData::Serialize;
  __return_storage_ptr__->deserialize = ApproximateQuantileBindData::Deserialize;
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction ApproxQuantileDecimalFunction(const LogicalType &type) {
	auto function = GetApproximateQuantileDecimalAggregateFunction(type);
	function.name = "approx_quantile";
	function.serialize = ApproximateQuantileBindData::Serialize;
	function.deserialize = ApproximateQuantileBindData::Deserialize;
	return function;
}